

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmutex.h
# Opt level: O2

void __thiscall QBasicMutex::unlock(QBasicMutex *this)

{
  __pointer_type pQVar1;
  
  LOCK();
  pQVar1 = (this->d_ptr)._q_value._M_b._M_p;
  (this->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar1 == (__pointer_type)0x1) {
    return;
  }
  QBasicMutex::unlockInternalFutex(this);
  return;
}

Assistant:

inline void unlock() noexcept {
        Q_ASSERT(d_ptr.loadRelaxed()); //mutex must be locked

        QtTsan::mutexPreUnlock(this, 0u);

        if constexpr (FutexAlwaysAvailable) {
            // we always unlock if we have futexes
            if (QMutexPrivate *d = d_ptr.fetchAndStoreRelease(nullptr); d != dummyLocked())
                unlockInternalFutex(d);     // was contended
        } else {
            // if we don't have futexes, we can only unlock if not contended
            if (QMutexPrivate *d; !d_ptr.testAndSetRelease(dummyLocked(), nullptr, d))
                unlockInternal(d);          // was contended
        }

        QtTsan::mutexPostUnlock(this, 0u);
    }